

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

int re_compile_and_search
              (re_context *ctx,char *pattern,size_t patlen,char *searchstr,size_t searchlen,
              int *result_len)

{
  re_status_t rVar1;
  re_pattern_buffer *in_RDI;
  re_registers *in_R9;
  re_machine machine;
  re_machine *in_stack_00000420;
  size_t in_stack_00000428;
  char *in_stack_00000430;
  re_context *in_stack_00000438;
  char *in_stack_ffffffffffffffb8;
  re_context *in_stack_ffffffffffffffc0;
  int local_4;
  
  rVar1 = re_compile(in_stack_00000438,in_stack_00000430,in_stack_00000428,in_stack_00000420);
  if (rVar1 == RE_STATUS_SUCCESS) {
    re_save_search_str(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0x151d2e);
    memset(&in_RDI->fastmap,0,0xa0);
    local_4 = re_search(in_RDI,(char *)in_RDI[3].buffer,(int)in_RDI[3].allocated,
                        (int)&stack0xffffffffffffffc0,(int)in_RDI + 0x20,in_R9);
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int re_compile_and_search(re_context *ctx,
                          const char *pattern, size_t patlen,
                          const char *searchstr, size_t searchlen,
                          int *result_len)
{
    re_machine machine;
    
    /* compile the expression - return failure if we get an error */
    if (re_compile(ctx, pattern, patlen, &machine) != RE_STATUS_SUCCESS)
        return -1;

    /* save the search string in our internal buffer */
    re_save_search_str(ctx, searchstr, searchlen);

    /* clear the group registers */
    memset(ctx->regs, 0, sizeof(ctx->regs));

    /* 
     *   search for the pattern in our copy of the string - use the copy
     *   so that the group registers stay valid even if the caller
     *   deallocates the original string after we return
     */
    return re_search(ctx, ctx->strbuf, ctx->curlen, &machine,
                     ctx->regs, result_len);
}